

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondResult.cpp
# Opt level: O1

void __thiscall oout::CondResult::CondResult(CondResult *this,bool cond,string *message)

{
  pointer pcVar1;
  
  (this->super_Result)._vptr_Result = (_func_int **)&PTR__CondResult_00120868;
  this->cond = cond;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

CondResult::CondResult(bool cond, const string &message)
	: cond(cond), message(message)
{
}